

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O2

void __thiscall
amrex::EB2::Level::fillFaceCent(Level *this,Array<MultiFab_*,_3> *a_facecent,Geometry *geom)

{
  int dst_nghost;
  int num_comp;
  FabArray<amrex::FArrayBox> *this_00;
  int idim;
  long lVar1;
  int idim_1;
  FabArray<amrex::FArrayBox> *src;
  Periodicity local_40;
  
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (&a_facecent->_M_elems[lVar1]->super_FabArray<amrex::FArrayBox>,0.0);
  }
  if (this->m_allregular == false) {
    src = (FabArray<amrex::FArrayBox> *)&this->m_facecent;
    for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
      this_00 = &a_facecent->_M_elems[lVar1]->super_FabArray<amrex::FArrayBox>;
      dst_nghost = (this_00->super_FabArrayBase).n_grow.vect[0];
      num_comp = (this_00->super_FabArrayBase).n_comp;
      local_40 = Geometry::periodicity(geom);
      FabArray<amrex::FArrayBox>::ParallelCopy(this_00,src,0,0,num_comp,0,dst_nghost,&local_40,COPY)
      ;
      src = src + 1;
    }
  }
  return;
}

Assistant:

void
Level::fillFaceCent (Array<MultiFab*,AMREX_SPACEDIM> const& a_facecent, const Geometry& geom) const
{
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        a_facecent[idim]->setVal(0.0);
    }
    if (!isAllRegular()) {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
        {
            auto& facecent = *a_facecent[idim];
            a_facecent[idim]->ParallelCopy(m_facecent[idim],0,0,facecent.nComp(),
                                           0,facecent.nGrow(),geom.periodicity());
        }
    }
}